

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gbs_Emu.cpp
# Opt level: O3

blargg_err_t __thiscall Gbs_Emu::load_(Gbs_Emu *this,Data_Reader *in)

{
  ushort uVar1;
  uint uVar2;
  char *pcVar3;
  blargg_err_t pcVar4;
  
  pcVar3 = Rom_Data_::load_rom_data_(&(this->rom).super_Rom_Data_,in,0x70,&this->header_,0,0x4008);
  if (pcVar3 == (blargg_err_t)0x0) {
    uVar2 = (uint)(this->header_).track_count;
    (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.raw_track_count_ = uVar2;
    (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.track_count_ = uVar2;
    pcVar3 = "Wrong file type for this emulator";
    if ((this->header_).tag[2] == 'S' && *(short *)(this->header_).tag == 0x4247) {
      if ((this->header_).vers != '\x01') {
        (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_ = "Unknown file version";
      }
      if (((this->header_).timer_mode & 0x78) != 0) {
        (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_ = "Invalid timer mode";
      }
      uVar1 = *(ushort *)(this->header_).load_addr;
      if ((uVar1 < 0x400) ||
         ((char)((byte)(uVar1 >> 8) | (this->header_).init_addr[1] | (this->header_).play_addr[1]) <
          '\0')) {
        (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_ =
             "Invalid load/init/play address";
      }
      (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 4;
      (this->apu).volume_unit = (this->super_Classic_Emu).super_Music_Emu.gain_ * 0.000625;
      Gb_Apu::update_volume(&this->apu);
      pcVar4 = Classic_Emu::setup_buffer(&this->super_Classic_Emu,0x400000);
      return pcVar4;
    }
  }
  return pcVar3;
}

Assistant:

blargg_err_t Gbs_Emu::load_( Data_Reader& in )
{
	assert( offsetof (header_t,copyright [32]) == header_size );
	RETURN_ERR( rom.load( in, header_size, &header_, 0 ) );
	
	set_track_count( header_.track_count );
	RETURN_ERR( check_gbs_header( &header_ ) );
	
	if ( header_.vers != 1 )
		set_warning( "Unknown file version" );
	
	if ( header_.timer_mode & 0x78 )
		set_warning( "Invalid timer mode" );
	
	unsigned load_addr = get_le16( header_.load_addr );
	if ( (header_.load_addr [1] | header_.init_addr [1] | header_.play_addr [1]) > 0x7F ||
			load_addr < 0x400 )
		set_warning( "Invalid load/init/play address" );
	
	set_voice_count( Gb_Apu::osc_count );
	
	apu.volume( gain() );
	
	return setup_buffer( 4194304 );
}